

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf2yaml.cpp
# Opt level: O3

void dumpDebugARanges(DWARFContext *DCtx,Data *Y)

{
  DataExtractor data;
  pointer pDVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t extraout_RDX;
  pointer pDVar4;
  ARangeDescriptor local_e8;
  uint64_t local_d0;
  uint64_t Offset;
  DWARFDebugArangeSet Set;
  undefined6 uStack_86;
  undefined1 local_80 [8];
  ARange Range;
  
  iVar3 = (*((DCtx->DObj)._M_t.
             super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
             .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
            _vptr_DWARFObject[0xc])();
  Range.Descriptors.
  super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar3);
  iVar3 = (*((DCtx->DObj)._M_t.
             super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
             .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
            _vptr_DWARFObject[5])();
  local_d0 = 0;
  llvm::DWARFDebugArangeSet::DWARFDebugArangeSet((DWARFDebugArangeSet *)&Offset);
  while( true ) {
    Set.ArangeDescriptors.
    super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)Range.Descriptors.
                  super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    data.AddressSize = '\0';
    data.IsLittleEndian = (byte)iVar3;
    data._18_6_ = uStack_86;
    data.Data.Length = extraout_RDX;
    data.Data.Data =
         (char *)Range.Descriptors.
                 super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    bVar2 = llvm::DWARFDebugArangeSet::extract((DWARFDebugArangeSet *)&Offset,data,&local_d0);
    pDVar1 = Set.ArangeDescriptors.
             super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (!bVar2) break;
    Range.AddrSize = '\0';
    Range.SegSize = '\0';
    Range._26_6_ = 0;
    Range.Descriptors.
    super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    Range.Descriptors.
    super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((uint32_t)Set.Offset == 0xffffffff) {
      Range.Length.TotalLength = 0xffffffff;
      Range.Length._4_4_ = 0;
    }
    local_80._0_4_ = (uint32_t)Set.Offset;
    Range.Length.TotalLength64._0_2_ = (undefined2)Set.HeaderData.Length;
    Range.Length.TotalLength64._4_4_ = Set.Offset._4_4_;
    Range.Version = Set.HeaderData.Length._2_2_;
    for (pDVar4 = (pointer)Set._16_8_; pDVar4 != pDVar1; pDVar4 = pDVar4 + 1) {
      local_e8.Address.value = pDVar4->Address;
      local_e8.Length = pDVar4->Length;
      if (Range.Descriptors.
          super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          Range.Descriptors.
          super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<llvm::DWARFYAML::ARangeDescriptor,std::allocator<llvm::DWARFYAML::ARangeDescriptor>>
        ::_M_realloc_insert<llvm::DWARFYAML::ARangeDescriptor_const&>
                  ((vector<llvm::DWARFYAML::ARangeDescriptor,std::allocator<llvm::DWARFYAML::ARangeDescriptor>>
                    *)&Range.AddrSize,
                   (iterator)
                   Range.Descriptors.
                   super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
                   ._M_impl.super__Vector_impl_data._M_start,&local_e8);
      }
      else {
        ((Range.Descriptors.
          super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
          ._M_impl.super__Vector_impl_data._M_start)->Address).value = local_e8.Address.value;
        (Range.Descriptors.
         super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
         ._M_impl.super__Vector_impl_data._M_start)->Length = local_e8.Length;
        Range.Descriptors.
        super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
        ._M_impl.super__Vector_impl_data._M_start =
             Range.Descriptors.
             super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    std::vector<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>::push_back
              (&Y->ARanges,(value_type *)local_80);
    if (Range._24_8_ != 0) {
      operator_delete((void *)Range._24_8_,
                      (long)Range.Descriptors.
                            super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
                            ._M_impl.super__Vector_impl_data._M_finish - Range._24_8_);
    }
  }
  if (Set._16_8_ != 0) {
    operator_delete((void *)Set._16_8_,
                    (long)Set.ArangeDescriptors.
                          super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
                          ._M_impl.super__Vector_impl_data._M_finish - Set._16_8_);
  }
  return;
}

Assistant:

void dumpDebugARanges(DWARFContext &DCtx, DWARFYAML::Data &Y) {
  DataExtractor ArangesData(DCtx.getDWARFObj().getArangesSection(),
                            DCtx.isLittleEndian(), 0);
  uint64_t Offset = 0;
  DWARFDebugArangeSet Set;

  while (Set.extract(ArangesData, &Offset)) {
    DWARFYAML::ARange Range;
    Range.Length.setLength(Set.getHeader().Length);
    Range.Version = Set.getHeader().Version;
    Range.CuOffset = Set.getHeader().CuOffset;
    Range.AddrSize = Set.getHeader().AddrSize;
    Range.SegSize = Set.getHeader().SegSize;
    for (auto Descriptor : Set.descriptors()) {
      DWARFYAML::ARangeDescriptor Desc;
      Desc.Address = Descriptor.Address;
      Desc.Length = Descriptor.Length;
      Range.Descriptors.push_back(Desc);
    }
    Y.ARanges.push_back(Range);
  }
}